

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall CEngine::CEngine(CEngine *this,char *pAppname)

{
  CJobPool *this_00;
  int64 iVar1;
  
  (this->super_IEngine).super_IInterface.m_pKernel = (IKernel *)0x0;
  (this->super_IEngine).super_IInterface._vptr_IInterface = (_func_int **)&PTR__IEngine_00213948;
  this_00 = &(this->super_IEngine).m_JobPool;
  CJobPool::CJobPool(this_00);
  (this->super_IEngine).super_IInterface._vptr_IInterface = (_func_int **)&PTR__CEngine_002138c8;
  iVar1 = time_get();
  srand((uint)iVar1);
  dbg_logger_stdout();
  dbg_logger_debugger();
  dbg_msg("engine","running on %s-%s-%s","unix","linux","amd64");
  dbg_msg("engine","arch is little endian");
  CJobPool::Init(this_00,1);
  this->m_Logging = false;
  this->m_DataLogSent = (IOHANDLE)0x0;
  this->m_DataLogRecv = (IOHANDLE)0x0;
  this->m_pAppname = pAppname;
  return;
}

Assistant:

CEngine(const char *pAppname)
	{
		srand(time_get());
		dbg_logger_stdout();
		dbg_logger_debugger();

		//
		dbg_msg("engine", "running on %s-%s-%s", CONF_FAMILY_STRING, CONF_PLATFORM_STRING, CONF_ARCH_STRING);
	#ifdef CONF_ARCH_ENDIAN_LITTLE
		dbg_msg("engine", "arch is little endian");
	#elif defined(CONF_ARCH_ENDIAN_BIG)
		dbg_msg("engine", "arch is big endian");
	#else
		dbg_msg("engine", "unknown endian");
	#endif

		m_JobPool.Init(1);

		m_DataLogSent = 0;
		m_DataLogRecv = 0;
		m_Logging = false;
		m_pAppname = pAppname;
	}